

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O3

uint8_t * __thiscall pktalloc::Allocator::fallbackAllocate(Allocator *this,uint bytes)

{
  void *pvVar1;
  uint8_t *puVar2;
  uint uVar3;
  int iVar4;
  
  iVar4 = (bytes + 0x1f >> 5) + 1;
  pvVar1 = calloc(1,(ulong)(uint)(iVar4 * 0x20) + 0x20);
  if (pvVar1 == (void *)0x0) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    uVar3 = (uint)pvVar1 & 0x1f;
    *(char *)((long)pvVar1 + (0x1f - (ulong)uVar3)) = (char)uVar3;
    *(int *)((long)pvVar1 + (0x28 - (ulong)uVar3)) = iVar4;
    puVar2 = (uint8_t *)((long)pvVar1 + (0x40 - (ulong)uVar3));
  }
  return puVar2;
}

Assistant:

uint8_t* Allocator::fallbackAllocate(unsigned bytes)
{
    // Calculate number of units required by this allocation
    // Note: +1 for the AllocationHeader
    const unsigned units = (bytes + kUnitSize - 1) / kUnitSize + 1;

    uint8_t* ptr = SIMDSafeAllocate(kUnitSize * units);
    if (!ptr) {
        return nullptr;
    }

    AllocationHeader* regionHeader = (AllocationHeader*)ptr;
#ifdef PKTALLOC_DEBUG
    regionHeader->Canary = AllocationHeader::kCanaryExpected;
#endif // PKTALLOC_DEBUG
    regionHeader->Header = nullptr;
    regionHeader->UsedUnits = units;

    return ptr + kUnitSize;
}